

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

void av1_init_mb_wiener_var_buffer(AV1_COMP *cpi)

{
  WeberStats *pWVar1;
  int *piVar2;
  double *pdVar3;
  
  cpi->weber_bsize = BLOCK_8X8;
  pWVar1 = cpi->mb_weber_stats;
  if ((cpi->oxcf).enable_rate_guide_deltaq != 0) {
    if ((pWVar1 == (WeberStats *)0x0) || (cpi->prep_rate_estimates == (int *)0x0))
    goto LAB_00191fd9;
    pWVar1 = (WeberStats *)cpi->ext_rate_distribution;
  }
  if (pWVar1 != (WeberStats *)0x0) {
    return;
  }
LAB_00191fd9:
  pWVar1 = (WeberStats *)
           aom_calloc((long)(cpi->frame_info).mi_cols * (long)(cpi->frame_info).mi_rows,0x38);
  cpi->mb_weber_stats = pWVar1;
  if (pWVar1 == (WeberStats *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->mb_weber_stats");
  }
  if ((cpi->oxcf).enable_rate_guide_deltaq != 0) {
    piVar2 = (int *)aom_calloc((long)(cpi->frame_info).mi_cols * (long)(cpi->frame_info).mi_rows,4);
    cpi->prep_rate_estimates = piVar2;
    if (piVar2 == (int *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->prep_rate_estimates");
    }
    pdVar3 = (double *)
             aom_calloc((long)(cpi->frame_info).mi_cols * (long)(cpi->frame_info).mi_rows,8);
    cpi->ext_rate_distribution = pdVar3;
    if (pdVar3 == (double *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->ext_rate_distribution");
      return;
    }
  }
  return;
}

Assistant:

void av1_init_mb_wiener_var_buffer(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;

  // This block size is also used to determine number of workers in
  // multi-threading. If it is changed, one needs to change it accordingly in
  // "compute_num_ai_workers()".
  cpi->weber_bsize = BLOCK_8X8;

  if (cpi->oxcf.enable_rate_guide_deltaq) {
    if (cpi->mb_weber_stats && cpi->prep_rate_estimates &&
        cpi->ext_rate_distribution)
      return;
  } else {
    if (cpi->mb_weber_stats) return;
  }

  CHECK_MEM_ERROR(cm, cpi->mb_weber_stats,
                  aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                             sizeof(*cpi->mb_weber_stats)));

  if (cpi->oxcf.enable_rate_guide_deltaq) {
    CHECK_MEM_ERROR(
        cm, cpi->prep_rate_estimates,
        aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                   sizeof(*cpi->prep_rate_estimates)));

    CHECK_MEM_ERROR(
        cm, cpi->ext_rate_distribution,
        aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                   sizeof(*cpi->ext_rate_distribution)));
  }
}